

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8>::forward_mul_mat
          (tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t iVar5;
  size_t sVar6;
  size_t sVar7;
  int64_t n_per_row;
  ggml_from_float_t p_Var8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ggml_type_traits_cpu *pgVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  int64_t extraout_RDX;
  int64_t nrow;
  int64_t extraout_RDX_00;
  size_t sVar18;
  size_t extraout_RDX_01;
  long lVar19;
  undefined8 uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  void *vy;
  ulong uVar24;
  void *pvVar25;
  
  pgVar1 = op->src[0];
  sVar18 = pgVar1->ne[1];
  if (op->ne[0] == sVar18) {
    pgVar2 = op->src[1];
    uVar3 = pgVar2->ne[1];
    if (op->ne[1] == uVar3) {
      if (op->ne[2] == pgVar2->ne[2]) {
        if (op->ne[3] == pgVar2->ne[3]) {
          if (op->nb[0] == 4) {
            uVar4 = op->nb[1];
            if (uVar4 < 4) {
              pcVar17 = "nb0 <= nb1";
              uVar20 = 0x17ca;
            }
            else if (op->nb[2] < uVar4) {
              pcVar17 = "nb1 <= nb2";
              uVar20 = 0x17cb;
            }
            else if (op->nb[3] < op->nb[2]) {
              pcVar17 = "nb2 <= nb3";
              uVar20 = 0x17cc;
            }
            else if (pgVar2->type == GGML_TYPE_F32) {
              iVar5 = pgVar1->ne[0];
              sVar6 = pgVar1->nb[1];
              sVar7 = pgVar2->nb[1];
              n_per_row = pgVar2->ne[0];
              lVar22 = (long)params->ith;
              iVar21 = params->nth;
              uVar10 = (ulong)iVar21;
              iVar9 = ggml_n_dims();
              if (iVar9 == 2) {
                pvVar25 = params->wdata;
                lVar11 = ggml_row_size(8,n_per_row);
                pgVar12 = ggml_get_type_traits_cpu(GGML_TYPE_Q8_0);
                p_Var8 = pgVar12->from_float;
                uVar23 = lVar22 * 4;
                uVar13 = uVar3 + 3;
                if (-1 < (long)uVar3) {
                  uVar13 = uVar3;
                }
                uVar13 = uVar13 & 0xfffffffffffffffc;
                if (uVar13 != uVar23 && SBORROW8(uVar13,uVar23) == (long)(uVar13 + lVar22 * -4) < 0)
                {
                  lVar19 = sVar7 * uVar23;
                  lVar14 = (long)(iVar21 * 4);
                  vy = (void *)(lVar11 * uVar23 + (long)pvVar25);
                  nrow = extraout_RDX;
                  do {
                    ggml_quantize_mat_t<4l,(ggml_type)8>
                              ((float *)((long)pgVar2->data + lVar19),vy,nrow,n_per_row);
                    uVar23 = uVar23 + lVar14;
                    vy = (void *)((long)vy + lVar11 * lVar14);
                    lVar19 = lVar19 + sVar7 * lVar14;
                    nrow = extraout_RDX_00;
                  } while ((long)uVar23 < (long)uVar13);
                }
                lVar14 = uVar13 + lVar22;
                if (lVar14 < (long)uVar3) {
                  lVar19 = sVar7 * lVar14;
                  pvVar25 = (void *)((long)pvVar25 + lVar11 * lVar14);
                  do {
                    (*p_Var8)((float *)((long)pgVar2->data + lVar19),pvVar25,n_per_row);
                    lVar14 = lVar14 + uVar10;
                    pvVar25 = (void *)((long)pvVar25 + lVar11 * uVar10);
                    lVar19 = lVar19 + sVar7 * uVar10;
                  } while (lVar14 < (long)uVar3);
                }
                ggml_barrier(params->threadpool);
                pvVar25 = params->wdata;
                lVar11 = ggml_row_size(8,n_per_row);
                uVar15 = (long)(sVar18 * lVar22) / (long)uVar10;
                uVar16 = (long)((lVar22 + 1) * sVar18) / (long)uVar10;
                uVar23 = uVar15 + 3;
                if (-1 < (long)uVar15) {
                  uVar23 = uVar15;
                }
                uVar24 = (uVar23 & 0xfffffffffffffffc) + 4;
                if (uVar15 == (uVar23 & 0xfffffffffffffffc)) {
                  uVar24 = uVar15;
                }
                uVar23 = uVar16 + 3;
                if (-1 < (long)uVar16) {
                  uVar23 = uVar16;
                }
                uVar15 = (uVar23 & 0xfffffffffffffffc) + 4;
                if (uVar16 == (uVar23 & 0xfffffffffffffffc)) {
                  uVar15 = uVar16;
                }
                if ((long)uVar24 < (long)uVar15) {
                  iVar21 = (int)iVar5;
                  iVar9 = (int)uVar13;
                  if (3 < (long)uVar3) {
                    gemm<block_q4_0,4l,4l,(ggml_type)8>
                              (iVar21,(float *)(uVar24 * 4 + (long)op->data),sVar18,
                               (void *)(uVar24 * sVar6 + (long)pgVar1->data),pvVar25,iVar9,
                               (int)uVar15 - (int)uVar24);
                    uVar10 = uVar13;
                  }
                  lVar22 = (long)iVar9;
                  if (lVar22 < (long)uVar3) {
                    sVar18 = lVar11 * lVar22;
                    pvVar25 = (void *)((long)pvVar25 + sVar18);
                    lVar14 = uVar4 * lVar22 + uVar24 * 4;
                    do {
                      gemv<block_q4_0,4l,4l,(ggml_type)8>
                                (iVar21,(float *)((long)op->data + lVar14),sVar18,
                                 (void *)((long)pgVar1->data + sVar6 * uVar24),pvVar25,(int)uVar10,
                                 (int)uVar15 - (int)uVar24);
                      lVar14 = lVar14 + uVar4;
                      lVar22 = lVar22 + 1;
                      pvVar25 = (void *)((long)pvVar25 + lVar11);
                      sVar18 = extraout_RDX_01;
                    } while (lVar22 < (long)uVar3);
                  }
                }
                return;
              }
              pcVar17 = "ggml_n_dims(op->src[0]) == 2";
              uVar20 = 0x17d0;
            }
            else {
              pcVar17 = "src1->type == GGML_TYPE_F32";
              uVar20 = 0x17ce;
            }
          }
          else {
            pcVar17 = "nb0 == sizeof(float)";
            uVar20 = 0x17c9;
          }
        }
        else {
          pcVar17 = "ne3 == ne13";
          uVar20 = 0x17c6;
        }
      }
      else {
        pcVar17 = "ne2 == ne12";
        uVar20 = 0x17c5;
      }
    }
    else {
      pcVar17 = "ne1 == ne11";
      uVar20 = 0x17c4;
    }
  }
  else {
    pcVar17 = "ne0 == ne01";
    uVar20 = 0x17c3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar20,"GGML_ASSERT(%s) failed",pcVar17);
}

Assistant:

void forward_mul_mat(ggml_compute_params * params, ggml_tensor * op) {
        const ggml_tensor * src0 = op->src[0];
        const ggml_tensor * src1 = op->src[1];
        ggml_tensor *       dst  = op;

        GGML_TENSOR_BINARY_OP_LOCALS

        const int ith = params->ith;
        const int nth = params->nth;

        GGML_ASSERT(ne0 == ne01);
        GGML_ASSERT(ne1 == ne11);
        GGML_ASSERT(ne2 == ne12);
        GGML_ASSERT(ne3 == ne13);

        // dst cannot be transposed or permuted
        GGML_ASSERT(nb0 == sizeof(float));
        GGML_ASSERT(nb0 <= nb1);
        GGML_ASSERT(nb1 <= nb2);
        GGML_ASSERT(nb2 <= nb3);

        GGML_ASSERT(src1->type == GGML_TYPE_F32);

        GGML_ASSERT(ggml_n_dims(op->src[0]) == 2);
        // GGML_ASSERT(ggml_n_dims(op->src[1]) == 2);

        char *       wdata = static_cast<char *>(params->wdata);
        const size_t nbw1  = ggml_row_size(PARAM_TYPE, ne10);

        assert(params->wsize >= nbw1 * ne11);

        const ggml_from_float_t from_float = ggml_get_type_traits_cpu(PARAM_TYPE)->from_float;

        int64_t i11_processed = 0;
        for (int64_t i11 = ith * 4; i11 < ne11 - ne11 % 4; i11 += nth * 4) {
            ggml_quantize_mat_t<INTER_SIZE, PARAM_TYPE>((float *) ((char *) src1->data + i11 * nb11), (void *) (wdata + i11 * nbw1), 4, ne10);
        }

        i11_processed = ne11 - ne11 % 4;
        for (int64_t i11 = i11_processed + ith; i11 < ne11; i11 += nth) {
            from_float((float *) ((char *) src1->data + i11 * nb11), (void *) (wdata + i11 * nbw1), ne10);
        }

        ggml_barrier(params->threadpool);

        const void * src1_wdata      = params->wdata;
        const size_t src1_col_stride = ggml_row_size(PARAM_TYPE, ne10);
        int64_t      src0_start      = (ith * ne01) / nth;
        int64_t      src0_end        = ((ith + 1) * ne01) / nth;
        src0_start = (src0_start % NB_COLS) ? src0_start + NB_COLS - (src0_start % NB_COLS) : src0_start;
        src0_end   = (src0_end   % NB_COLS) ? src0_end   + NB_COLS - (src0_end   % NB_COLS) : src0_end;
        if (src0_start >= src0_end) {
            return;
        }

        // If there are more than three rows in src1, use gemm; otherwise, use gemv.
        if (ne11 > 3) {
            gemm<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                    (float *) ((char *) dst->data) + src0_start, ne01,
                    (const char *) src0->data + src0_start * nb01,
                    (const char *) src1_wdata, ne11 - ne11 % 4, src0_end - src0_start);
        }
        for (int iter = ne11 - ne11 % 4; iter < ne11; iter++) {
            gemv<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                    (float *) ((char *) dst->data + (iter * nb1)) + src0_start, ne01,
                    (const char *) src0->data + src0_start * nb01,
                    (const char *) src1_wdata + (src1_col_stride * iter), 1,
                    src0_end - src0_start);
        }
    }